

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O3

void __thiscall vec<vec<Clause_*>_>::~vec(vec<vec<Clause_*>_> *this)

{
  vec<Clause_*> *pvVar1;
  void *__ptr;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar2 = this->sz;
  if (uVar2 != 0) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      pvVar1 = this->data;
      __ptr = *(void **)((long)&pvVar1->sz + lVar3);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        uVar2 = this->sz;
      }
      *(undefined8 *)((long)&pvVar1->sz + lVar3) = 0;
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x10;
    } while (uVar4 < uVar2);
  }
  if (this->data != (vec<Clause_*> *)0x0) {
    free(this->data);
  }
  this->data = (vec<Clause_*> *)0x0;
  return;
}

Assistant:

~vec() {
		for (unsigned int i = 0; i < sz; i++) {
			data[i].~T();
		}
		if (data) {
			free(data);
		}
		data = nullptr;
	}